

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O3

void __thiscall wasm::DAEScanner::visitCall(DAEScanner *this,Call *curr)

{
  iterator __position;
  DAEFunctionInfo *pDVar1;
  Function *pFVar2;
  vector<wasm::Call*,std::allocator<wasm::Call*>> *this_00;
  __node_gen_type __node_gen;
  Call *curr_local;
  
  __node_gen._M_h = (__hashtable_alloc *)curr;
  pFVar2 = Module::getFunction((this->
                               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                               ).
                               super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>
                               .
                               super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>
                               .currModule,(Name)(curr->target).super_IString.str);
  if ((pFVar2->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
    this_00 = (vector<wasm::Call*,std::allocator<wasm::Call*>> *)
              std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->info->calls,&curr->target);
    __position._M_current = *(Call ***)(this_00 + 8);
    if (__position._M_current == *(Call ***)(this_00 + 0x10)) {
      std::vector<wasm::Call*,std::allocator<wasm::Call*>>::_M_realloc_insert<wasm::Call*const&>
                (this_00,__position,(Call **)&__node_gen);
      curr = (Call *)__node_gen;
    }
    else {
      *__position._M_current = curr;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
  }
  if (curr->isReturn == true) {
    pDVar1 = this->info;
    pDVar1->hasTailCalls = true;
    std::
    _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
              ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&pDVar1->tailCallees,&curr->target);
  }
  return;
}

Assistant:

void visitCall(Call* curr) {
    if (!getModule()->getFunction(curr->target)->imported()) {
      info->calls[curr->target].push_back(curr);
    }
    if (curr->isReturn) {
      info->hasTailCalls = true;
      info->tailCallees.insert(curr->target);
    }
  }